

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rom_parser.c
# Opt level: O0

void cleanup_PRG_and_CHR_banks(void)

{
  byte local_a;
  byte local_9;
  uint8_t bank_num_1;
  uint8_t bank_num;
  
  for (local_9 = 0; local_9 < parsed_header.PRG_ROM_chunks; local_9 = local_9 + 1) {
    free(PRG_rom_banks[local_9]);
  }
  for (local_a = 0; local_a < parsed_header.CHR_ROM_chunks; local_a = local_a + 1) {
    free(CHR_rom_banks[local_a]);
  }
  free(PRG_rom_banks);
  free(CHR_rom_banks);
  return;
}

Assistant:

void cleanup_PRG_and_CHR_banks() {
    for(uint8_t bank_num = 0; bank_num < parsed_header.PRG_ROM_chunks; bank_num++) {
        free(PRG_rom_banks[bank_num]);
    }

    for(uint8_t bank_num = 0; bank_num < parsed_header.CHR_ROM_chunks; bank_num++) {
        free(CHR_rom_banks[bank_num]);
    }

    free(PRG_rom_banks);
    free(CHR_rom_banks);
}